

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
getOpenFileImpl<llvm::MemoryBuffer>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,int FD,Twine *Filename,uint64_t FileSize,uint64_t MapSize,
          int64_t Offset,bool RequiresNullTerminator,bool IsVolatile)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  AlignedCharArray<8UL,_8UL> this;
  uint64_t uVar4;
  uint64_t offset;
  char *pcVar5;
  uint *puVar6;
  ssize_t sVar7;
  error_category *peVar8;
  void *__buf;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
  *Val;
  ulong uVar9;
  MemoryBuffer *pMVar10;
  long lVar11;
  error_code EC;
  error_code eVar12;
  NamedBufferAlloc local_98;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
  local_90;
  file_status Status;
  
  if ((getOpenFileImpl<llvm::MemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
       ::PageSize == '\0') &&
     (iVar3 = __cxa_guard_acquire(&getOpenFileImpl<llvm::MemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
                                   ::PageSize), iVar3 != 0)) {
    getOpenFileImpl<llvm::MemoryBuffer>::PageSize = llvm::sys::Process::getPageSize();
    __cxa_guard_release(&getOpenFileImpl<llvm::MemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
                         ::PageSize);
  }
  if ((MapSize == 0xffffffffffffffff) && (MapSize = FileSize, FileSize == 0xffffffffffffffff)) {
    Status.super_basic_file_status.fs_st_size._0_4_ = 0;
    Status.super_basic_file_status.fs_st_size._4_4_ = 0;
    Status.super_basic_file_status.Type = status_error;
    Status.super_basic_file_status.fs_st_atime_nsec = 0;
    Status.super_basic_file_status.fs_st_mtime_nsec = 0;
    Status.super_basic_file_status.fs_st_uid = 0;
    Status.super_basic_file_status.fs_st_gid = 0;
    Status.super_basic_file_status.fs_st_atime = 0;
    Status.super_basic_file_status.fs_st_mtime = 0;
    Status.super_basic_file_status.Perms = perms_not_known;
    Status.fs_st_dev = 0;
    Status.fs_st_nlinks = 0;
    Status.fs_st_ino = 0;
    eVar12 = llvm::sys::fs::status(FD,&Status);
    peVar8 = eVar12._M_cat;
    if (eVar12._M_value == 0) {
      if ((Status.super_basic_file_status.Type != regular_file) &&
         (Status.super_basic_file_status.Type != block_file)) {
        getMemoryBufferForStream
                  ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                    *)&local_90.TStorage,FD,Filename);
        llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
        moveConstruct<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
                  ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                    *)__return_storage_ptr__,
                   (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                    *)&local_90.TStorage);
        llvm::
        ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
        ::~ErrorOr((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                    *)&local_90.TStorage);
        return __return_storage_ptr__;
      }
      FileSize = CONCAT44(Status.super_basic_file_status.fs_st_size._4_4_,
                          (undefined4)Status.super_basic_file_status.fs_st_size);
      MapSize = FileSize;
      goto LAB_001481be;
    }
    uVar9 = (ulong)(uint)eVar12._M_value;
LAB_001483db:
    EC._M_cat = peVar8;
    EC._0_8_ = uVar9;
    llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    ErrorOr(__return_storage_ptr__,EC);
  }
  else {
LAB_001481be:
    bVar2 = shouldUseMmap(FD,FileSize,MapSize,Offset,RequiresNullTerminator,
                          getOpenFileImpl<llvm::MemoryBuffer>::PageSize,IsVolatile);
    if (bVar2) {
      Status.super_basic_file_status.fs_st_atime =
           Status.super_basic_file_status.fs_st_atime & 0xffffffff00000000;
      Status.super_basic_file_status.fs_st_mtime = std::_V2::system_category();
      local_98.Name = Filename;
      this.buffer = (char  [8])operator_new(0x30,&local_98);
      *(undefined ***)this.buffer = &PTR__MemoryBufferMMapFile_001c8f40;
      uVar4 = anon_unknown.dwarf_19e7a3::MemoryBufferMMapFile<llvm::MemoryBuffer>::getLegalMapOffset
                        (Offset);
      offset = anon_unknown.dwarf_19e7a3::MemoryBufferMMapFile<llvm::MemoryBuffer>::
               getLegalMapOffset(Offset);
      llvm::sys::fs::mapped_file_region::mapped_file_region
                ((mapped_file_region *)((long)this.buffer + 0x18),FD,readonly,
                 (Offset + MapSize) - uVar4,offset,(error_code *)&Status);
      if ((int)Status.super_basic_file_status.fs_st_atime != 0) {
LAB_001482b3:
        (**(code **)(*(long *)this.buffer + 8))(this.buffer);
        goto LAB_001482c2;
      }
      pcVar5 = llvm::sys::fs::mapped_file_region::const_data
                         ((mapped_file_region *)((long)this.buffer + 0x18));
      uVar4 = anon_unknown.dwarf_19e7a3::MemoryBufferMMapFile<llvm::MemoryBuffer>::getLegalMapOffset
                        (Offset);
      llvm::MemoryBuffer::init
                ((MemoryBuffer *)this.buffer,(EVP_PKEY_CTX *)(pcVar5 + (Offset - uVar4)));
      local_90.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
           (AlignedCharArrayUnion<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
            )this.buffer;
      if ((int)Status.super_basic_file_status.fs_st_atime != 0) goto LAB_001482b3;
      Val = &local_90;
      llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
      ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
                 &Val->TStorage,(type *)0x0);
    }
    else {
LAB_001482c2:
      llvm::WritableMemoryBuffer::getNewUninitMemBuffer
                ((WritableMemoryBuffer *)&Status,MapSize,Filename);
      pMVar10 = (MemoryBuffer *)Status.super_basic_file_status.fs_st_atime;
      if (Status.super_basic_file_status.fs_st_atime == 0) {
        peVar8 = (error_category *)std::_V2::generic_category();
        uVar9 = 0xc;
        goto LAB_001483db;
      }
      __buf = *(void **)(Status.super_basic_file_status.fs_st_atime + 8);
      lVar11 = Offset + MapSize;
      for (; MapSize != 0; MapSize = MapSize - sVar7) {
        puVar6 = (uint *)__errno_location();
        while( true ) {
          *puVar6 = 0;
          sVar7 = pread(FD,__buf,MapSize,lVar11 - MapSize);
          if (sVar7 != -1) break;
          uVar1 = *puVar6;
          if (uVar1 != 4) {
            peVar8 = (error_category *)std::_V2::generic_category();
            eVar12._4_4_ = 0;
            eVar12._M_value = uVar1;
            eVar12._M_cat = peVar8;
            llvm::
            ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
            ::ErrorOr(__return_storage_ptr__,eVar12);
            goto LAB_00148396;
          }
        }
        if (sVar7 == 0) {
          memset(__buf,0,MapSize);
          break;
        }
        __buf = (void *)((long)__buf + sVar7);
      }
      Val = (anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
             *)&Status;
      llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
      ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                  *)&Val->TStorage,(type *)0x0);
    }
    pMVar10 = (((__uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
               &((basic_file_status *)&(Val->ErrorStorage).super_AlignedCharArray<8UL,_16UL>)->
                fs_st_atime)->_M_t).
              super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
              .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
LAB_00148396:
    if (pMVar10 != (MemoryBuffer *)0x0) {
      (*((MemoryBuffer *)&pMVar10->_vptr_MemoryBuffer)->_vptr_MemoryBuffer[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getOpenFileImpl(int FD, const Twine &Filename, uint64_t FileSize,
                uint64_t MapSize, int64_t Offset, bool RequiresNullTerminator,
                bool IsVolatile) {
  static int PageSize = sys::Process::getPageSize();

  // Default is to map the full file.
  if (MapSize == uint64_t(-1)) {
    // If we don't know the file size, use fstat to find out.  fstat on an open
    // file descriptor is cheaper than stat on a random path.
    if (FileSize == uint64_t(-1)) {
      sys::fs::file_status Status;
      std::error_code EC = sys::fs::status(FD, Status);
      if (EC)
        return EC;

      // If this not a file or a block device (e.g. it's a named pipe
      // or character device), we can't trust the size. Create the memory
      // buffer by copying off the stream.
      sys::fs::file_type Type = Status.type();
      if (Type != sys::fs::file_type::regular_file &&
          Type != sys::fs::file_type::block_file)
        return getMemoryBufferForStream(FD, Filename);

      FileSize = Status.getSize();
    }
    MapSize = FileSize;
  }

  if (shouldUseMmap(FD, FileSize, MapSize, Offset, RequiresNullTerminator,
                    PageSize, IsVolatile)) {
    std::error_code EC;
    std::unique_ptr<MB> Result(
        new (NamedBufferAlloc(Filename)) MemoryBufferMMapFile<MB>(
            RequiresNullTerminator, FD, MapSize, Offset, EC));
    if (!EC)
      return std::move(Result);
  }

  auto Buf = WritableMemoryBuffer::getNewUninitMemBuffer(MapSize, Filename);
  if (!Buf) {
    // Failed to create a buffer. The only way it can fail is if
    // new(std::nothrow) returns 0.
    return make_error_code(errc::not_enough_memory);
  }

  char *BufPtr = Buf.get()->getBufferStart();

  size_t BytesLeft = MapSize;
#ifndef HAVE_PREAD
  if (lseek(FD, Offset, SEEK_SET) == -1)
    return std::error_code(errno, std::generic_category());
#endif

  while (BytesLeft) {
#ifdef HAVE_PREAD
    ssize_t NumRead = sys::RetryAfterSignal(-1, ::pread, FD, BufPtr, BytesLeft,
                                            MapSize - BytesLeft + Offset);
#else
    ssize_t NumRead = sys::RetryAfterSignal(-1, ::read, FD, BufPtr, BytesLeft);
#endif
    if (NumRead == -1) {
      // Error while reading.
      return std::error_code(errno, std::generic_category());
    }
    if (NumRead == 0) {
      memset(BufPtr, 0, BytesLeft); // zero-initialize rest of the buffer.
      break;
    }
    BytesLeft -= NumRead;
    BufPtr += NumRead;
  }

  return std::move(Buf);
}